

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

bool __thiscall
VulkanHppGenerator::determineEnumeration
          (VulkanHppGenerator *this,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  pointer puVar6;
  bool bVar7;
  
  p_Var5 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    bVar7 = (_Rb_tree_header *)p_Var5 != &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
    if (!bVar7) {
      return false;
    }
    puVar6 = puVar1;
    do {
      if (puVar6 == puVar2) goto LAB_001249fb;
      uVar3 = *puVar6;
      puVar6 = puVar6 + 1;
    } while (*(unsigned_long *)(p_Var5 + 1) != uVar3);
    if (*(char *)&p_Var5[1]._M_right != '\0') {
      return bVar7;
    }
    puVar6 = puVar1;
    while (puVar6 != puVar2) {
      p_Var4 = (_Base_ptr)*puVar6;
      puVar6 = puVar6 + 1;
      if (p_Var5[1]._M_parent == p_Var4) {
        return true;
      }
    }
LAB_001249fb:
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

bool VulkanHppGenerator::determineEnumeration( std::map<size_t, VectorParamData> const & vectorParams, std::vector<size_t> const & returnParams ) const
{
  // a command is considered to be enumerating some data, if for at least one vectorParam the data is a returnParam and either the vectorParams is
  // specified by a structure or the lenParam is a returnParam as well
  return std::ranges::any_of( vectorParams,
                              [&returnParams]( auto const & vp )
                              {
                                return std::ranges::any_of( returnParams, [&vp]( size_t rp ) { return rp == vp.first; } ) &&
                                       ( vp.second.byStructure ||
                                         std::ranges::any_of( returnParams, [&vp]( size_t rp ) { return rp == vp.second.lenParam; } ) );
                              } );
}